

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void anon_unknown.dwarf_57ca7::getEdgePoints<float>
               (vector<float,_std::allocator<float>_> *edge,vector<int,_std::allocator<int>_> *data,
               vector<int,_std::allocator<int>_> *first,vector<int,_std::allocator<int>_> *second,
               EdgeParameter *edgeParameter)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  const_reference pvVar7;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  bool edgeFound;
  uint32_t j_1;
  uint32_t minimumRightSide;
  uint32_t normalRightSide;
  bool minimumGradientRightEdgeFound;
  uint32_t in_stack_00000050;
  bool normalGradientRightEdgeFound;
  uint32_t j;
  uint32_t minimumLeftSide;
  uint32_t normalLeftSide;
  bool minimumGradientLeftEdgeFound;
  bool normalGradientleftEdgeFound;
  vector<int,_std::allocator<int>_> *in_stack_00000060;
  int halfGradient;
  int minGradientValue;
  int maxGradient;
  uint32_t i;
  bool checkContrast;
  int minimumContrast;
  uint32_t dataSize;
  int local_88;
  int local_84;
  int local_80;
  bool local_75;
  uint local_74;
  uint local_64;
  uint local_48;
  
  sVar6 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  local_48 = 1;
  do {
    if ((int)sVar6 - 2U <= local_48) {
      return;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(ulong)local_48);
    if ((-1 < *pvVar7) &&
       (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(ulong)(local_48 + 1)),
       *pvVar7 < 1)) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_48);
      iVar1 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)(local_48 + 1));
      if (*pvVar7 < iVar1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_48);
        local_80 = *pvVar7;
      }
      else {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)(local_48 + 1));
        local_80 = *pvVar7;
      }
      if (0 < local_80) {
        if (local_80 < 3) {
          local_84 = 1;
        }
        else {
          local_84 = local_80 / 3;
        }
        if (local_80 < 2) {
          local_88 = 1;
        }
        else {
          local_88 = local_80 / 2;
        }
        bVar3 = false;
        bVar5 = false;
        local_64 = local_48;
        while( true ) {
          if ((!bVar3) &&
             (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_64),
             *pvVar7 < local_88)) {
            bVar3 = true;
          }
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_64);
          if (*pvVar7 < local_84) break;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_64);
          if ((local_80 < *pvVar7) || (local_64 == 0)) goto LAB_0013cfb4;
          local_64 = local_64 - 1;
        }
        bVar5 = true;
LAB_0013cfb4:
        if ((bVar3) || (bVar5)) {
          bVar4 = false;
          bVar2 = false;
          local_74 = local_48;
          do {
            local_74 = local_74 + 1;
            if ((int)sVar6 - 1U <= local_74) break;
            if ((!bVar4) &&
               (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_74),
               *pvVar7 < local_88)) {
              bVar4 = true;
            }
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_74);
            if (*pvVar7 < local_84) {
              bVar2 = true;
              break;
            }
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(ulong)local_74);
          } while (*pvVar7 <= local_80);
          local_75 = false;
          if ((bVar3) && (bVar4)) {
            local_75 = findPoint<float>(_minGradientValue,in_stack_00000060,_minimumLeftSide,j,
                                        in_stack_00000050,normalRightSide,minimumRightSide._3_1_,
                                        (uint32_t)second,(uint32_t)first,(uint32_t)data,
                                        (uint32_t)edge);
          }
          if (((local_75 == false) && (bVar5)) && (bVar2)) {
            findPoint<float>(_minGradientValue,in_stack_00000060,_minimumLeftSide,j,
                             in_stack_00000050,normalRightSide,minimumRightSide._3_1_,
                             (uint32_t)second,(uint32_t)first,(uint32_t)data,(uint32_t)edge);
          }
        }
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void getEdgePoints( std::vector < _Type > & edge, const std::vector < int > & data, const std::vector < int > & first, const std::vector < int > & second, const EdgeParameter & edgeParameter )
    {
        const uint32_t dataSize = static_cast<uint32_t>(data.size()); // we know that initial size is uint32_t
        const int minimumContrast = static_cast<int>(edgeParameter.minimumContrast * edgeParameter.groupFactor);

        const bool checkContrast = (edgeParameter.contrastCheckLeftSideOffset > 0u) && (edgeParameter.contrastCheckRightSideOffset > 0u);

        for ( uint32_t i = 1u; i < dataSize - 2u; i++ ) {
            if ( second[i] < 0 || second[i + 1] > 0 )
                continue;

            const int maxGradient = (first[i] > first[i + 1]) ? first[i] : first[i + 1];

            if ( maxGradient <= 0 )
                continue;

            const int minGradientValue = (maxGradient < 3) ? 1 : maxGradient / 3;
            const int halfGradient     = (maxGradient < 2) ? 1 : maxGradient / 2;

            // left side
            bool normalGradientleftEdgeFound  = false;
            bool minimumGradientLeftEdgeFound = false;

            uint32_t normalLeftSide  = i;
            uint32_t minimumLeftSide = i;

            for ( uint32_t j = i; ; --j ) {
                if ( !normalGradientleftEdgeFound && first[j] < halfGradient ) {
                    normalLeftSide = j;
                    normalGradientleftEdgeFound = true;
                }

                if ( first[j] < minGradientValue ) {
                    minimumLeftSide = j;
                    minimumGradientLeftEdgeFound = true;
                    break;
                }

                if ( first[j] > maxGradient )
                    break;

                if ( j == 0u ) // this is to avoid out of bounds situation
                    break;
            }

            if ( !normalGradientleftEdgeFound && !minimumGradientLeftEdgeFound )
                continue;

            // right side
            bool normalGradientRightEdgeFound  = false;
            bool minimumGradientRightEdgeFound = false;

            uint32_t normalRightSide  = i + 1u;
            uint32_t minimumRightSide = i + 1u;

            for ( uint32_t j = i + 1u; j < dataSize - 1u; ++j ) {
                if ( !normalGradientRightEdgeFound && first[j] < halfGradient ) {
                    normalRightSide = j;
                    normalGradientRightEdgeFound = true;
                }

                if ( first[j] < minGradientValue ) {
                    minimumRightSide = j;
                    minimumGradientRightEdgeFound = true;
                    break;
                }

                if ( first[j] > maxGradient )
                    break;
            }

            bool edgeFound = false;

            if ( normalGradientleftEdgeFound && normalGradientRightEdgeFound ) {
                edgeFound = findPoint( data, second, edge, normalLeftSide, normalRightSide, minimumContrast, checkContrast,
                                       edgeParameter.contrastCheckLeftSideOffset, edgeParameter.contrastCheckRightSideOffset,
                                       i, dataSize );
            }

            if ( !edgeFound && minimumGradientLeftEdgeFound && minimumGradientRightEdgeFound ) {
                findPoint( data, second, edge, minimumLeftSide, minimumRightSide, minimumContrast, checkContrast,
                           edgeParameter.contrastCheckLeftSideOffset, edgeParameter.contrastCheckRightSideOffset,
                           i, dataSize );
            }
        }
    }